

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyScriptPubKeyMan::ImportScripts
          (LegacyScriptPubKeyMan *this,
          set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *scripts,int64_t timestamp)

{
  Span<const_unsigned_char> s;
  bool bVar1;
  CScript *in_RDX;
  char *in_RDI;
  long in_FS_OFFSET;
  CScript *entry;
  set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *__range1;
  iterator __end1;
  iterator __begin1;
  WalletBatch batch;
  CScriptID id;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  LegacyScriptPubKeyMan *in_stack_fffffffffffffef8;
  CScript *in_stack_ffffffffffffff00;
  WalletBatch *in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  char *params;
  ScriptPubKeyMan *in_stack_ffffffffffffff38;
  ConstevalFormatString<1U> wallet_fmt;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  byte bVar2;
  size_t in_stack_ffffffffffffff78;
  undefined1 local_1c [20];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  wallet_fmt.fmt = in_RDI;
  (**(code **)(**(long **)(in_RDI + 8) + 0x18))();
  WalletBatch::WalletBatch
            ((WalletBatch *)in_stack_fffffffffffffef8,
             (WalletDatabase *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             (bool)in_stack_fffffffffffffeef);
  std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>::begin
            ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>::end
            ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  do {
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffef8,
                            (_Self *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (0 < (long)in_RDX) {
        UpdateTimeFirstKey(in_stack_fffffffffffffef8,
                           CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      }
      bVar2 = 1;
LAB_01672815:
      WalletBatch::~WalletBatch
                ((WalletBatch *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return (bool)(bVar2 & 1);
    }
    std::_Rb_tree_const_iterator<CScript>::operator*
              ((_Rb_tree_const_iterator<CScript> *)
               CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    CScriptID::CScriptID
              ((CScriptID *)in_stack_ffffffffffffff00,(CScript *)in_stack_fffffffffffffef8);
    bVar2 = (**(code **)(*(long *)(in_RDI + 0x58) + 0x18))(in_RDI + 0x58,local_1c);
    if ((bVar2 & 1) == 0) {
      in_stack_ffffffffffffff16 =
           AddCScriptWithDB((LegacyScriptPubKeyMan *)
                            CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffff16,
                                                    in_stack_ffffffffffffff10)),
                            in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      if (!(bool)in_stack_ffffffffffffff16) {
        bVar2 = 0;
        goto LAB_01672815;
      }
      if (0 < (long)in_RDX) {
        in_stack_ffffffffffffff08 = (WalletBatch *)(in_RDI + 0x230);
        in_stack_ffffffffffffff00 = in_RDX;
        CScriptID::CScriptID((CScriptID *)in_RDX,(CScript *)in_stack_fffffffffffffef8);
        in_stack_fffffffffffffef8 =
             (LegacyScriptPubKeyMan *)
             std::
             map<CScriptID,_wallet::CKeyMetadata,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>_>
             ::operator[]((map<CScriptID,_wallet::CKeyMetadata,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>_>
                           *)CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffff16,
                                                     in_stack_ffffffffffffff10)),
                          (key_type *)in_stack_ffffffffffffff08);
        (in_stack_fffffffffffffef8->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage =
             (WalletStorage *)in_stack_ffffffffffffff00;
      }
    }
    else {
      params = "Already have script %s, skipping\n";
      Span<const_unsigned_char>::Span<CScript>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffffef8,
                 (CScript *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 (type)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      s.m_data._7_1_ = in_stack_ffffffffffffff77;
      s.m_data._0_7_ = in_stack_ffffffffffffff70;
      s.m_size = in_stack_ffffffffffffff78;
      HexStr_abi_cxx11_(s);
      ScriptPubKeyMan::WalletLogPrintf<std::__cxx11::string>
                (in_stack_ffffffffffffff38,wallet_fmt,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    }
    std::_Rb_tree_const_iterator<CScript>::operator++
              ((_Rb_tree_const_iterator<CScript> *)
               CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  } while( true );
}

Assistant:

bool LegacyScriptPubKeyMan::ImportScripts(const std::set<CScript> scripts, int64_t timestamp)
{
    WalletBatch batch(m_storage.GetDatabase());
    for (const auto& entry : scripts) {
        CScriptID id(entry);
        if (HaveCScript(id)) {
            WalletLogPrintf("Already have script %s, skipping\n", HexStr(entry));
            continue;
        }
        if (!AddCScriptWithDB(batch, entry)) {
            return false;
        }

        if (timestamp > 0) {
            m_script_metadata[CScriptID(entry)].nCreateTime = timestamp;
        }
    }
    if (timestamp > 0) {
        UpdateTimeFirstKey(timestamp);
    }

    return true;
}